

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

int linenoise::unicodePrevGraphemeLen(char *buf,int pos)

{
  int iVar1;
  int local_28;
  int local_24;
  int cp;
  int len;
  int end;
  int pos_local;
  char *buf_local;
  
  cp = pos;
  len = pos;
  _end = buf;
  if (pos == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    do {
      if (len < 1) {
        return 0;
      }
      local_24 = unicodePrevUTF8CharLen(_end,len);
      len = len - local_24;
      local_28 = 0;
      unicodeUTF8CharToCodePoint(_end + len,local_24,&local_28);
      iVar1 = unicodeIsCombiningChar((long)local_28);
    } while (iVar1 != 0);
    buf_local._4_4_ = cp - len;
  }
  return buf_local._4_4_;
}

Assistant:

inline int unicodePrevGraphemeLen(char* buf, int pos)
{
    if (pos == 0) {
        return 0;
    }
    int end = pos;
    while (pos > 0) {
        int len = unicodePrevUTF8CharLen(buf, pos);
        pos -= len;
        int cp = 0;
        unicodeUTF8CharToCodePoint(buf + pos, len, &cp);
        if (!unicodeIsCombiningChar(cp)) {
            return end - pos;
        }
    }
    return 0;
}